

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

cf_bool_t cf_thread_equal(cf_thread_t t1,cf_thread_t t2)

{
  int iVar1;
  cf_thread_t t2_local;
  cf_thread_t t1_local;
  
  iVar1 = pthread_equal(t1,t2);
  t1_local._4_4_ = (uint)(iVar1 != 0);
  return t1_local._4_4_;
}

Assistant:

cf_bool_t cf_thread_equal(cf_thread_t t1, cf_thread_t t2) {
#ifdef CF_OS_WIN
    return (t1 == t2) ? CF_OK : CF_NOK;
#else
    if(pthread_equal(t1, t2)) return CF_TRUE;
    else return CF_FALSE;
#endif
}